

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O2

istream * operator>>(istream *strm,Employee *obj)

{
  operator>>((istream *)&std::cin,&obj->super_Person);
  std::operator<<((ostream *)&std::cout,"hourWork: ");
  std::istream::operator>>((istream *)strm,&obj->hourWork);
  std::operator<<((ostream *)&std::cout,"salaryPerHour: ");
  std::istream::operator>>((istream *)strm,&obj->salaryPerHour);
  std::operator<<((ostream *)&std::cout,"workToDo: ");
  std::istream::operator>>((istream *)strm,&obj->workToDo);
  std::operator<<((ostream *)&std::cout,"workDone: ");
  std::istream::operator>>((istream *)strm,&obj->workDone);
  return strm;
}

Assistant:

istream &operator>>(istream &strm, Employee &obj) {
    cin >> static_cast<Person &>(obj);
    cout << "hourWork: ";
    strm >> obj.hourWork;
    cout << "salaryPerHour: ";
    strm >> obj.salaryPerHour;
    cout << "workToDo: ";
    strm >> obj.workToDo;
    cout << "workDone: ";
    strm >> obj.workDone;
    return strm;
}